

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

void Imf_3_4::anon_unknown_0::core_error_handler_cb(exr_const_context_t f,int code,char *msg)

{
  FILE *__stream;
  int iVar1;
  char *in_RAX;
  char *pcVar2;
  undefined8 uVar3;
  char *fn;
  char *local_28;
  
  local_28 = in_RAX;
  pcVar2 = getenv("EXR_CHECK_ENABLE_PRINTS");
  if (pcVar2 != (char *)0x0) {
    iVar1 = exr_get_file_name(f,&local_28);
    __stream = _stderr;
    if (iVar1 != 0) {
      local_28 = "<error>";
    }
    pcVar2 = local_28;
    uVar3 = exr_get_error_code_as_string(code);
    fprintf(__stream,"ERROR \'%s\' (%s): %s\n",pcVar2,uVar3,msg);
  }
  return;
}

Assistant:

static void
core_error_handler_cb (exr_const_context_t f, int code, const char* msg)
{
    if (getenv ("EXR_CHECK_ENABLE_PRINTS") != NULL)
    {
        const char* fn;
        if (EXR_ERR_SUCCESS != exr_get_file_name (f, &fn)) fn = "<error>";
        fprintf (
            stderr,
            "ERROR '%s' (%s): %s\n",
            fn,
            exr_get_error_code_as_string (code),
            msg);
    }
}